

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

re2 * __thiscall re2::ProgToString_abi_cxx11_(re2 *this,Prog *prog,Workq *q)

{
  uint uVar1;
  uint *puVar2;
  SparseSet *pSVar3;
  int iVar4;
  InstOp IVar5;
  uint *puVar6;
  undefined8 uVar7;
  Inst local_68 [4];
  Inst *local_48;
  Inst *ip;
  int id;
  uint *local_30;
  iterator i;
  SparseSet *local_20;
  Workq *q_local;
  Prog *prog_local;
  string *s;
  
  i._7_1_ = 0;
  local_20 = q;
  q_local = (Workq *)prog;
  prog_local = (Prog *)this;
  std::__cxx11::string::string((string *)this);
  for (local_30 = (uint *)SparseSet::begin(local_20); puVar2 = local_30,
      puVar6 = (uint *)SparseSet::end(local_20), puVar2 != puVar6; local_30 = local_30 + 1) {
    ip._0_4_ = *local_30;
    local_48 = Prog::inst((Prog *)q_local,(uint)ip);
    uVar1 = (uint)ip;
    Prog::Inst::Dump_abi_cxx11_(local_68);
    uVar7 = std::__cxx11::string::c_str();
    StringAppendF((string *)this,"%d. %s\n",(ulong)uVar1,uVar7);
    std::__cxx11::string::~string((string *)local_68);
    pSVar3 = local_20;
    iVar4 = Prog::Inst::out(local_48);
    AddToQueue(pSVar3,iVar4);
    IVar5 = Prog::Inst::opcode(local_48);
    if ((IVar5 == kInstAlt) || (IVar5 = Prog::Inst::opcode(local_48), IVar5 == kInstAltMatch)) {
      pSVar3 = local_20;
      iVar4 = Prog::Inst::out1(local_48);
      AddToQueue(pSVar3,iVar4);
    }
  }
  return this;
}

Assistant:

static string ProgToString(Prog* prog, Workq* q) {
  string s;
  for (Workq::iterator i = q->begin(); i != q->end(); ++i) {
    int id = *i;
    Prog::Inst* ip = prog->inst(id);
    StringAppendF(&s, "%d. %s\n", id, ip->Dump().c_str());
    AddToQueue(q, ip->out());
    if (ip->opcode() == kInstAlt || ip->opcode() == kInstAltMatch)
      AddToQueue(q, ip->out1());
  }
  return s;
}